

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

StringMapEntryBase * __thiscall llvm::StringMapImpl::RemoveKey(StringMapImpl *this,StringRef Key)

{
  int iVar1;
  StringMapEntryBase *pSVar2;
  StringMapEntryBase *Result;
  int Bucket;
  StringMapImpl *this_local;
  StringRef Key_local;
  
  iVar1 = FindKey(this,Key);
  if (iVar1 == -1) {
    Key_local.Length = 0;
  }
  else {
    Key_local.Length = (size_t)this->TheTable[iVar1];
    pSVar2 = getTombstoneVal();
    this->TheTable[iVar1] = pSVar2;
    this->NumItems = this->NumItems - 1;
    this->NumTombstones = this->NumTombstones + 1;
    if (this->NumBuckets < this->NumItems + this->NumTombstones) {
      __assert_fail("NumItems + NumTombstones <= NumBuckets",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringMap.cpp"
                    ,0xc2,"StringMapEntryBase *llvm::StringMapImpl::RemoveKey(StringRef)");
    }
  }
  return (StringMapEntryBase *)Key_local.Length;
}

Assistant:

StringMapEntryBase *StringMapImpl::RemoveKey(StringRef Key) {
  int Bucket = FindKey(Key);
  if (Bucket == -1) return nullptr;

  StringMapEntryBase *Result = TheTable[Bucket];
  TheTable[Bucket] = getTombstoneVal();
  --NumItems;
  ++NumTombstones;
  assert(NumItems + NumTombstones <= NumBuckets);

  return Result;
}